

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

ON_DimStyle * __thiscall
ON_Annotation::DimensionStyle
          (ON_Annotation *this,ON_DimStyle *parent_dimstyle,bool bForceOverrideUpdate)

{
  bool bVar1;
  ON_UUID *a;
  ON_UUID *b;
  ON__UINT64 OVar2;
  ON_SHA1_Hash *a_00;
  ON_SHA1_Hash *b_00;
  
  if (this->m_override_dimstyle == (ON_DimStyle *)0x0) {
    return parent_dimstyle;
  }
  bVar1 = ON_DimStyle::HasOverrides(this->m_override_dimstyle);
  if (bVar1) {
    if (bForceOverrideUpdate) {
LAB_003b3100:
      ON_DimStyle::OverrideFields
                (this->m_override_dimstyle,this->m_override_dimstyle,parent_dimstyle);
      bVar1 = ON_DimStyle::HasOverrides(this->m_override_dimstyle);
      if (!bVar1) goto LAB_003b313a;
      OVar2 = ON_ModelComponent::ContentVersionNumber(&parent_dimstyle->super_ON_ModelComponent);
      this->m_parent_dimstyle_content_version_number = OVar2;
    }
    else {
      a = ON_ModelComponent::ParentId(&this->m_override_dimstyle->super_ON_ModelComponent);
      b = ON_ModelComponent::Id(&parent_dimstyle->super_ON_ModelComponent);
      bVar1 = ::operator!=(a,b);
      if ((bVar1) ||
         (OVar2 = ON_ModelComponent::ContentVersionNumber(&parent_dimstyle->super_ON_ModelComponent)
         , OVar2 != this->m_parent_dimstyle_content_version_number)) goto LAB_003b3100;
      a_00 = ON_DimStyle::ParentContentHash(this->m_override_dimstyle);
      b_00 = ON_DimStyle::ContentHash(parent_dimstyle);
      bVar1 = ::operator!=(a_00,b_00);
      if (bVar1) goto LAB_003b3100;
    }
    parent_dimstyle = this->m_override_dimstyle;
  }
  else {
LAB_003b313a:
    Internal_DeleteOverrideDimstyle(this);
  }
  return parent_dimstyle;
}

Assistant:

const ON_DimStyle& ON_Annotation::DimensionStyle(
  const ON_DimStyle& parent_dimstyle,
  bool bForceOverrideUpdate
) const
{
  if (nullptr == m_override_dimstyle )
    return parent_dimstyle;

  if (false == m_override_dimstyle->HasOverrides())
  {
    Internal_DeleteOverrideDimstyle();
    return parent_dimstyle;
  }

  if (
    bForceOverrideUpdate
    || m_override_dimstyle->ParentId() != parent_dimstyle.Id() 
    || parent_dimstyle.ContentVersionNumber() != m_parent_dimstyle_content_version_number
    || m_override_dimstyle->ParentContentHash() != parent_dimstyle.ContentHash()
    )
  {
    // update m_override_dimstyle if parent content has changed.
    m_override_dimstyle->OverrideFields(*m_override_dimstyle, parent_dimstyle);
    if (false == m_override_dimstyle->HasOverrides())
    {
      // Updating overrides unsets all overrides that match parent values.
      // When this happens, the overrides are deleted here.
      Internal_DeleteOverrideDimstyle();
      return parent_dimstyle;
    }
    m_parent_dimstyle_content_version_number = parent_dimstyle.ContentVersionNumber();
  }

  return *m_override_dimstyle;
}